

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O2

void __thiscall ot::commissioner::coap::Coap::Retransmit(Coap *this,Timer *param_1)

{
  RequestsCache *this_00;
  char cVar1;
  long lVar2;
  char *pcVar3;
  TimePoint TVar4;
  char *pcVar5;
  Error *this_01;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  allocator local_219;
  undefined1 local_218 [8];
  char *pcStack_210;
  char *local_208;
  size_t sStack_200;
  format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_1f8;
  format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *pfStack_1f0;
  code *local_1e8;
  code *pcStack_1e0;
  code *local_1d8;
  Error error;
  string uri_1;
  writer write_3;
  format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *pfStack_170;
  RequestHolder requestHolder;
  writer write_1;
  string local_e8;
  writer write;
  char *pcStack_c0;
  undefined1 local_a8 [40];
  undefined1 local_80 [40];
  undefined1 local_58 [40];
  
  lVar2 = std::chrono::_V2::system_clock::now();
  std::__cxx11::string::string((string *)local_218,"coap",(allocator *)&uri_1);
  requestHolder.mRequest.
  super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(requestHolder.mRequest.
                super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr._4_4_,0xe);
  pcVar3 = "client(={}) retransmit timer triggered";
  requestHolder.mRequest.
  super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)anon_var_dwarf_10cc60;
  requestHolder.mHandler.super__Function_base._M_functor._M_unused._M_member_pointer = 0x26;
  requestHolder.mHandler.super__Function_base._M_functor._8_8_ = 0x100000000;
  requestHolder.mHandler._M_invoker =
       ::fmt::v10::detail::parse_format_specs<void*,fmt::v10::detail::compile_parse_context<char>>;
  requestHolder.mHandler.super__Function_base._M_manager = (_Manager_type)&requestHolder;
  write.handler_ = (format_string_checker<char> *)&requestHolder;
  do {
    if (pcVar3 == "") {
LAB_001446b5:
      fmt.size_ = 0xe;
      fmt.data_ = (char *)0x26;
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)&requestHolder;
      requestHolder.mRequest.
      super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      ::fmt::v10::vformat_abi_cxx11_
                ((string *)&error,(v10 *)"client(={}) retransmit timer triggered",fmt,args);
      Log(kDebug,(string *)local_218,(string *)&error);
      std::__cxx11::string::~string((string *)&error);
      std::__cxx11::string::~string((string *)local_218);
      this_00 = &this->mRequestsCache;
      do {
        if (((this->mRequestsCache).mContainer._M_t._M_impl.super__Rb_tree_header._M_node_count == 0
            ) || (TVar4 = RequestsCache::Earliest(this_00), lVar2 <= (long)TVar4.__d.__r)) {
          RequestsCache::UpdateTimer(this_00);
          return;
        }
        RequestsCache::Eliminate(&requestHolder,this_00);
        std::__cxx11::string::string((string *)&write,"UNKOWN_URI",(allocator *)local_218);
        Message::GetUriPath((Error *)local_218,
                            requestHolder.mRequest.
                            super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr,(string *)&write);
        std::__cxx11::string::~string((string *)&pcStack_210);
        if (requestHolder.mRetransmissionCount < 4 &&
            (undefined1  [12])
            ((undefined1  [12])
             (requestHolder.mRequest.
              super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             )->mHeader & (undefined1  [12])0xc) == (undefined1  [12])0x0) {
          requestHolder.mRetransmissionCount = requestHolder.mRetransmissionCount + 1;
          requestHolder.mNextTimerShot.__d.__r =
               (duration)(requestHolder.mRetransmissionDelay.__r * 2000000 + lVar2);
          requestHolder.mRetransmissionDelay.__r = requestHolder.mRetransmissionDelay.__r * 2;
          RequestsCache::Put(this_00,&requestHolder);
          uri_1._M_dataplus._M_p = (pointer)&uri_1.field_2;
          uri_1._M_string_length = 0;
          uri_1.field_2._M_local_buf[0] = '\0';
          Message::GetUriPath((Error *)local_58,
                              requestHolder.mRequest.
                              super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr,&uri_1);
          std::__cxx11::string::~string((string *)(local_58 + 8));
          if (requestHolder.mAcknowledged == false) {
            std::__cxx11::string::string((string *)&error,"coap",(allocator *)&write_3);
            local_218._0_4_ = pointer_type;
            local_218._4_4_ = string_type;
            pcStack_210 = (char *)CONCAT44(pcStack_210._4_4_,2);
            local_208 = "client(={}) retransmit request {}, retransmit count = {}";
            sStack_200 = 0x38;
            local_1f8 = (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                         *)0x300000000;
            local_1d8 = ::fmt::v10::detail::
                        parse_format_specs<unsigned_int,fmt::v10::detail::compile_parse_context<char>>
            ;
            local_1e8 = ::fmt::v10::detail::
                        parse_format_specs<void*,fmt::v10::detail::compile_parse_context<char>>;
            pcStack_1e0 = ::fmt::v10::detail::
                          parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
            ;
            pcVar3 = "client(={}) retransmit request {}, retransmit count = {}";
            pfStack_1f0 = (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                           *)local_218;
            write_1.handler_ =
                 (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_218;
            while (pcVar3 != "") {
              cVar1 = *pcVar3;
              pcVar5 = pcVar3;
              while (cVar1 != '{') {
                pcVar5 = pcVar5 + 1;
                if (pcVar5 == "") {
                  ::fmt::v10::detail::
                  parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                  ::writer::operator()((writer *)&write_1,pcVar3,"");
                  goto LAB_00144b7e;
                }
                cVar1 = *pcVar5;
              }
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
              ::writer::operator()((writer *)&write_1,pcVar3,pcVar5);
              pcVar3 = ::fmt::v10::detail::
                       parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,void*,std::__cxx11::string,unsigned_int>&>
                                 (pcVar5,"",
                                  (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                                   *)local_218);
            }
LAB_00144b7e:
            local_1f8 = (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                         *)(ulong)requestHolder.mRetransmissionCount;
            local_208 = uri_1._M_dataplus._M_p;
            sStack_200 = uri_1._M_string_length;
            fmt_02.size_ = 0x2de;
            fmt_02.data_ = (char *)0x38;
            args_02.field_1.args_ = in_R9.args_;
            args_02.desc_ = (unsigned_long_long)local_218;
            local_218 = (undefined1  [8])this;
            ::fmt::v10::vformat_abi_cxx11_
                      (&local_e8,(v10 *)"client(={}) retransmit request {}, retransmit count = {}",
                       fmt_02,args_02);
            Log(kInfo,(string *)&error,&local_e8);
            std::__cxx11::string::~string((string *)&local_e8);
            std::__cxx11::string::~string((string *)&error);
            Send(&error,this,
                 requestHolder.mRequest.
                 super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
            if (error.mCode != kNone) {
              std::__cxx11::string::string((string *)&local_e8,"coap",&local_219);
              local_218._0_4_ = pointer_type;
              local_218._4_4_ = string_type;
              pcStack_210 = (char *)CONCAT44(pcStack_210._4_4_,0xd);
              local_208 = "client(={}) retransmit request {} failed: {}";
              sStack_200 = 0x2c;
              local_1f8 = (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                           *)0x300000000;
              local_1d8 = ::fmt::v10::detail::
                          parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
              ;
              local_1e8 = ::fmt::v10::detail::
                          parse_format_specs<void*,fmt::v10::detail::compile_parse_context<char>>;
              pcStack_1e0 = ::fmt::v10::detail::
                            parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
              ;
              pcVar3 = "client(={}) retransmit request {} failed: {}";
              pfStack_1f0 = (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                             *)local_218;
              write_3.handler_ =
                   (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                    *)local_218;
              while (pcVar3 != "") {
                cVar1 = *pcVar3;
                pcVar5 = pcVar3;
                while (cVar1 != '{') {
                  pcVar5 = pcVar5 + 1;
                  if (pcVar5 == "") {
                    ::fmt::v10::detail::
                    parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::writer::operator()(&write_3,pcVar3,"");
                    goto LAB_00144ce7;
                  }
                  cVar1 = *pcVar5;
                }
                ::fmt::v10::detail::
                parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::writer::operator()(&write_3,pcVar3,pcVar5);
                pcVar3 = ::fmt::v10::detail::
                         parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,void*,std::__cxx11::string,std::__cxx11::string>&>
                                   (pcVar5,"",
                                    (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                                     *)local_218);
              }
LAB_00144ce7:
              Error::ToString_abi_cxx11_((string *)&write_3,&error);
              local_208 = uri_1._M_dataplus._M_p;
              sStack_200 = uri_1._M_string_length;
              local_1f8 = write_3.handler_;
              pfStack_1f0 = pfStack_170;
              fmt_03.size_ = 0xdde;
              fmt_03.data_ = (char *)0x2c;
              args_03.field_1.args_ = in_R9.args_;
              args_03.desc_ = (unsigned_long_long)local_218;
              local_218 = (undefined1  [8])this;
              ::fmt::v10::vformat_abi_cxx11_
                        ((string *)&write_1,(v10 *)"client(={}) retransmit request {} failed: {}",
                         fmt_03,args_03);
              Log(kWarn,&local_e8,(string *)&write_1);
              std::__cxx11::string::~string((string *)&write_1);
              std::__cxx11::string::~string((string *)&write_3);
              std::__cxx11::string::~string((string *)&local_e8);
              Error::Error((Error *)local_80,&error);
              FinalizeTransaction(this,&requestHolder,(Response *)0x0,(Error *)local_80);
              std::__cxx11::string::~string((string *)(local_80 + 8));
            }
            std::__cxx11::string::~string((string *)&error.mMessage);
          }
          else {
            std::__cxx11::string::string((string *)&error,"coap",(allocator *)&write_3);
            local_218._0_4_ = pointer_type;
            local_218._4_4_ = string_type;
            pcStack_210 = "client(={}) request to {} has been acknowledged, won\'t retransmit";
            local_208 = (char *)0x41;
            sStack_200 = 0x200000000;
            pfStack_1f0 = (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                           *)::fmt::v10::detail::
                             parse_format_specs<void*,fmt::v10::detail::compile_parse_context<char>>
            ;
            local_1e8 = ::fmt::v10::detail::
                        parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
            ;
            pcVar3 = "client(={}) request to {} has been acknowledged, won\'t retransmit";
            local_1f8 = (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                         *)local_218;
            write_1.handler_ =
                 (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_218;
            while (pcVar3 != "") {
              cVar1 = *pcVar3;
              pcVar5 = pcVar3;
              while (cVar1 != '{') {
                pcVar5 = pcVar5 + 1;
                if (pcVar5 == "") {
                  ::fmt::v10::detail::
                  parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::writer::operator()(&write_1,pcVar3,"");
                  goto LAB_00144b08;
                }
                cVar1 = *pcVar5;
              }
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::writer::operator()(&write_1,pcVar3,pcVar5);
              pcVar3 = ::fmt::v10::detail::
                       parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,void*,std::__cxx11::string>&>
                                 (pcVar5,"",
                                  (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)local_218);
            }
LAB_00144b08:
            local_208 = uri_1._M_dataplus._M_p;
            sStack_200 = uri_1._M_string_length;
            fmt_01.size_ = 0xde;
            fmt_01.data_ = (char *)0x41;
            args_01.field_1.args_ = in_R9.args_;
            args_01.desc_ = (unsigned_long_long)local_218;
            local_218 = (undefined1  [8])this;
            ::fmt::v10::vformat_abi_cxx11_
                      (&local_e8,
                       (v10 *)"client(={}) request to {} has been acknowledged, won\'t retransmit",
                       fmt_01,args_01);
            Log(kDebug,(string *)&error,&local_e8);
            std::__cxx11::string::~string((string *)&local_e8);
            std::__cxx11::string::~string((string *)&error);
          }
          this_01 = (Error *)&uri_1;
        }
        else {
          local_218._0_4_ = string_type;
          pcStack_210 = "request to {} timeout";
          local_208 = (pointer)0x15;
          sStack_200 = 0x100000000;
          pfStack_1f0 = (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                         *)::fmt::v10::detail::
                           parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
          ;
          pcVar3 = "request to {} timeout";
          local_1f8 = (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                       *)local_218;
          while (pcVar5 = pcVar3, pcVar5 != "") {
            pcVar3 = pcVar5 + 1;
            if (*pcVar5 == '}') {
              if ((pcVar3 == "") || (*pcVar3 != '}')) {
                ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
              }
              pcVar3 = pcVar5 + 2;
            }
            else if (*pcVar5 == '{') {
              pcVar3 = ::fmt::v10::detail::
                       parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                                 (pcVar5,"",
                                  (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)local_218);
            }
          }
          local_218 = (undefined1  [8])write.handler_;
          pcStack_210 = pcStack_c0;
          fmt_00.size_ = 0xd;
          fmt_00.data_ = (char *)0x15;
          args_00.field_1.args_ = in_R9.args_;
          args_00.desc_ = (unsigned_long_long)local_218;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)&error,(v10 *)"request to {} timeout",fmt_00,args_00);
          local_a8._0_4_ = kTimeout;
          std::__cxx11::string::string((string *)(local_a8 + 8),(string *)&error);
          FinalizeTransaction(this,&requestHolder,(Response *)0x0,(Error *)local_a8);
          std::__cxx11::string::~string((string *)(local_a8 + 8));
          this_01 = &error;
        }
        std::__cxx11::string::~string((string *)this_01);
        std::__cxx11::string::~string((string *)&write);
        RequestHolder::~RequestHolder(&requestHolder);
      } while( true );
    }
    cVar1 = *pcVar3;
    pcVar5 = pcVar3;
    while (cVar1 != '{') {
      pcVar5 = pcVar5 + 1;
      if (pcVar5 == "") {
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*>_>::
        writer::operator()(&write,pcVar3,"");
        goto LAB_001446b5;
      }
      cVar1 = *pcVar5;
    }
    ::fmt::v10::detail::
    parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_void_*>_>::writer
    ::operator()(&write,pcVar3,pcVar5);
    pcVar3 = ::fmt::v10::detail::
             parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,void*>&>
                       (pcVar5,"",(format_string_checker<char> *)&requestHolder);
  } while( true );
}

Assistant:

void Coap::Retransmit(Timer &)
{
    auto now = Clock::now();

    LOG_DEBUG(LOG_REGION_COAP, "client(={}) retransmit timer triggered", static_cast<void *>(this));

    while (!mRequestsCache.IsEmpty() && mRequestsCache.Earliest() < now)
    {
        auto requestHolder = mRequestsCache.Eliminate();

        std::string uri = "UNKOWN_URI";
        requestHolder.mRequest->GetUriPath(uri).IgnoreError();

        if ((requestHolder.mRequest->IsConfirmable()) && (requestHolder.mRetransmissionCount < kMaxRetransmit))
        {
            // Increment retransmission counter and timer.
            ++requestHolder.mRetransmissionCount;
            requestHolder.mRetransmissionDelay *= 2;
            requestHolder.mNextTimerShot = now + requestHolder.mRetransmissionDelay;

            mRequestsCache.Put(requestHolder);

            std::string uri;
            IgnoreError(requestHolder.mRequest->GetUriPath(uri));

            // Retransmit
            if (!requestHolder.mAcknowledged)
            {
                LOG_INFO(LOG_REGION_COAP, "client(={}) retransmit request {}, retransmit count = {}",
                         static_cast<void *>(this), uri, requestHolder.mRetransmissionCount);

                auto error = Send(*requestHolder.mRequest);
                if (error != ErrorCode::kNone)
                {
                    LOG_WARN(LOG_REGION_COAP, "client(={}) retransmit request {} failed: {}", static_cast<void *>(this),
                             uri, error.ToString());
                    FinalizeTransaction(requestHolder, nullptr, error);
                }
            }
            else
            {
                LOG_DEBUG(LOG_REGION_COAP, "client(={}) request to {} has been acknowledged, won't retransmit",
                          static_cast<void *>(this), uri);
            }
        }
        else
        {
            // No expected response or acknowledgment.
            FinalizeTransaction(requestHolder, nullptr, ERROR_TIMEOUT("request to {} timeout", uri));
        }
    }

    mRequestsCache.UpdateTimer();
}